

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

size_t Curl_bufq_space(bufq *q)

{
  size_t sVar1;
  buf_chunk *chunk;
  buf_chunk *pbVar2;
  long lVar3;
  
  pbVar2 = q->tail;
  if (pbVar2 == (buf_chunk *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = pbVar2->dlen - pbVar2->w_offset;
  }
  pbVar2 = q->spare;
  if (pbVar2 != (buf_chunk *)0x0) {
    for (; pbVar2 != (buf_chunk *)0x0; pbVar2 = pbVar2->next) {
      sVar1 = sVar1 + pbVar2->dlen;
    }
  }
  lVar3 = q->max_chunks - q->chunk_count;
  if (q->chunk_count <= q->max_chunks && lVar3 != 0) {
    sVar1 = sVar1 + lVar3 * q->chunk_size;
  }
  return sVar1;
}

Assistant:

size_t Curl_bufq_space(const struct bufq *q)
{
  size_t space = 0;
  if(q->tail)
    space += chunk_space(q->tail);
  if(q->spare) {
    struct buf_chunk *chunk = q->spare;
    while(chunk) {
      space += chunk->dlen;
      chunk = chunk->next;
    }
  }
  if(q->chunk_count < q->max_chunks) {
    space += (q->max_chunks - q->chunk_count) * q->chunk_size;
  }
  return space;
}